

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O3

DWORD SearchPathW(LPCWSTR lpPath,LPCWSTR lpFileName,LPCWSTR lpExtension,DWORD nBufferLength,
                 LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  SIZE_T *lpBuffer_00;
  undefined8 uVar1;
  DWORD DVar2;
  int iVar3;
  size_t sVar4;
  char16_t *pcVar5;
  size_t sVar6;
  char *__format;
  size_t __n;
  char16_t *pcVar7;
  DWORD DVar8;
  SIZE_T SVar9;
  ulong count;
  long in_FS_OFFSET;
  undefined1 local_168 [8];
  PathWCharString FullPathPS;
  PathWCharString CanonicalPathPS;
  DWORD local_7c;
  undefined1 local_78 [8];
  PathCharString AnsiPathPS;
  
  AnsiPathPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  FullPathPS._64_8_ = local_168;
  FullPathPS.m_size = 0;
  AnsiPathPS._32_8_ = local_78;
  AnsiPathPS.m_size = 0;
  lpBuffer_00 = &FullPathPS.m_count;
  CanonicalPathPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012947b;
  if (lpPath == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x577);
    __format = "lpPath may not be NULL\n";
LAB_00128f8c:
    local_7c = 0x57;
    fprintf(_stderr,__format);
LAB_00128fa4:
    SetLastError(local_7c);
LAB_00128fac:
    DVar8 = 0;
  }
  else {
    if (lpFileName == (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x57d);
      __format = "lpFileName may not be NULL\n";
      goto LAB_00128f8c;
    }
    if (lpExtension != (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x583);
      local_7c = 0x57;
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      goto LAB_00128fa4;
    }
    if ((*lpFileName != L'\\') && (*lpFileName != L'/')) {
      sVar4 = PAL_wcslen(lpFileName);
      local_7c = 2;
      if (*lpPath != L'\0') {
LAB_00129208:
        pcVar5 = PAL_wcschr(lpPath,L':');
        if (pcVar5 == (char16_t *)0x0) {
          sVar6 = PAL_wcslen(lpPath);
          pcVar5 = lpPath + sVar6;
          pcVar7 = pcVar5;
        }
        else {
          pcVar7 = pcVar5 + 1;
        }
        __n = (long)pcVar5 - (long)lpPath;
        count = ((long)__n >> 1) + sVar4 + 1;
        if (count < 0x400) {
          if (pcVar5 != lpPath) {
            StackString<32UL,_char16_t>::Resize((StackString<32UL,_char16_t> *)local_168,count);
            uVar1 = FullPathPS._64_8_;
            if (FullPathPS._64_8_ != 0) {
              memcpy((void *)FullPathPS._64_8_,lpPath,__n);
              *(undefined2 *)(uVar1 + __n) = 0x2f;
              PAL_wcscpy((undefined2 *)(uVar1 + __n) + 1,lpFileName);
              if (count < FullPathPS.m_size) {
                FullPathPS.m_size = count;
              }
              *(undefined2 *)(FullPathPS._64_8_ + FullPathPS.m_size * 2) = 0;
              StackString<32UL,_char16_t>::Resize
                        ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,0x400);
              if (lpBuffer_00 != (SIZE_T *)0x0) {
                DVar2 = GetFullPathNameW((LPCWSTR)uVar1,0x401,(LPWSTR)lpBuffer_00,(LPWSTR *)0x0);
                if (DVar2 < CanonicalPathPS.m_size) {
                  CanonicalPathPS.m_size = (ulong)DVar2;
                }
                *(undefined2 *)((long)lpBuffer_00 + CanonicalPathPS.m_size * 2) = 0;
                if (0x401 < DVar2) {
                  StackString<32UL,_char16_t>::Resize
                            ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,(ulong)(DVar2 - 1));
                  if (lpBuffer_00 == (SIZE_T *)0x0) goto LAB_00129455;
                  DVar2 = GetFullPathNameW((LPCWSTR)uVar1,DVar2,(LPWSTR)lpBuffer_00,(LPWSTR *)0x0);
                  if (DVar2 < CanonicalPathPS.m_size) {
                    CanonicalPathPS.m_size = (ulong)DVar2;
                  }
                  *(undefined2 *)((long)lpBuffer_00 + CanonicalPathPS.m_size * 2) = 0;
                }
                if (DVar2 == 0) {
                  if (PAL_InitializeChakraCoreCalled != false) {
                    GetLastError();
                    goto LAB_00129424;
                  }
                  goto LAB_0012947b;
                }
                sVar6 = PAL_wcslen((char16_t *)lpBuffer_00);
                SVar9 = (long)MaxWCharToAcpLengthRatio * (sVar6 + 1);
                StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,SVar9);
                uVar1 = AnsiPathPS._32_8_;
                if (AnsiPathPS._32_8_ == 0) goto LAB_00129455;
                iVar3 = WideCharToMultiByte(0,0,(LPCWSTR)lpBuffer_00,-1,(LPSTR)AnsiPathPS._32_8_,
                                            (int)SVar9,(LPCSTR)0x0,(LPBOOL)0x0);
                if ((ulong)(long)iVar3 < AnsiPathPS.m_size) {
                  AnsiPathPS.m_size = (long)iVar3;
                }
                *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
                iVar3 = access((char *)uVar1,0);
                if (iVar3 == 0) goto LAB_00129170;
                goto LAB_00129424;
              }
            }
LAB_00129455:
            SetLastError(8);
            goto LAB_00128fac;
          }
        }
        else if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012947b;
LAB_00129424:
        lpPath = pcVar7;
        if (*pcVar7 == L'\0') goto LAB_00128fa4;
        goto LAB_00129208;
      }
      goto LAB_00128fa4;
    }
    StackString<32UL,_char16_t>::Resize((StackString<32UL,_char16_t> *)&FullPathPS.m_count,0x400);
    local_7c = 8;
    if (lpBuffer_00 == (SIZE_T *)0x0) goto LAB_00128fa4;
    DVar2 = GetFullPathNameW(lpFileName,0x401,(LPWSTR)lpBuffer_00,(LPWSTR *)0x0);
    FullPathPS.m_count._0_2_ = 0;
    if (0x401 < DVar2) {
      StackString<32UL,_char16_t>::Resize
                ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,(ulong)(DVar2 - 1));
      if (lpBuffer_00 == (SIZE_T *)0x0) goto LAB_00128fa4;
      DVar2 = GetFullPathNameW(lpFileName,DVar2,(LPWSTR)lpBuffer_00,(LPWSTR *)0x0);
    }
    FullPathPS.m_count._0_2_ = 0;
    if (DVar2 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012947b;
      local_7c = 0x57;
      GetLastError();
      goto LAB_00128fa4;
    }
    sVar4 = PAL_wcslen((char16_t *)lpBuffer_00);
    SVar9 = (long)MaxWCharToAcpLengthRatio * (sVar4 + 1);
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,SVar9);
    uVar1 = AnsiPathPS._32_8_;
    if (AnsiPathPS._32_8_ == 0) goto LAB_00128fa4;
    iVar3 = WideCharToMultiByte(0,0,(LPCWSTR)lpBuffer_00,-1,(LPSTR)AnsiPathPS._32_8_,(int)SVar9,
                                (LPCSTR)0x0,(LPBOOL)0x0);
    if ((ulong)(long)iVar3 < AnsiPathPS.m_size) {
      AnsiPathPS.m_size = (long)iVar3;
    }
    *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
    iVar3 = access((char *)uVar1,0);
    local_7c = 2;
    if (iVar3 != 0) goto LAB_00128fa4;
LAB_00129170:
    sVar4 = PAL_wcslen((char16_t *)lpBuffer_00);
    DVar2 = (DWORD)sVar4;
    DVar8 = DVar2 + 1;
    if (DVar2 + 1 <= nBufferLength) {
      if (lpBuffer == (LPWSTR)0x0) {
        local_7c = 0x57;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012947b;
        goto LAB_00128fa4;
      }
      PAL_wcscpy(lpBuffer,(char16_t *)lpBuffer_00);
      DVar8 = DVar2;
      if (lpFilePart != (LPWSTR *)0x0) {
        pcVar5 = PAL_wcsrchr(lpBuffer,L'/');
        *lpFilePart = pcVar5;
        if (pcVar5 == (char16_t *)0x0) {
          fprintf(_stderr,"] %s %s:%d","SearchPathW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                  ,0x64b);
          fprintf(_stderr,"no \'/\' in full path!\n");
        }
        else {
          *lpFilePart = pcVar5 + 1;
        }
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)&FullPathPS.m_count);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)local_168);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != AnsiPathPS.m_count) {
      __stack_chk_fail();
    }
    return DVar8;
  }
LAB_0012947b:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathW(
    IN LPCWSTR lpPath,
    IN LPCWSTR lpFileName,
    IN LPCWSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPWSTR lpBuffer,
    OUT LPWSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    WCHAR * FullPath;
    size_t FullPathLength = 0;
    PathWCharString FullPathPS;
    LPCWSTR pPathStart;
    LPCWSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD dw;
    DWORD length;
    char * AnsiPath;
    PathCharString AnsiPathPS;
    size_t CanonicalPathLength;
    int canonical_size;
    WCHAR * CanonicalPath;
    PathWCharString CanonicalPathPS;

    PERF_ENTRY(SearchPathW);
    ENTRY("SearchPathW(lpPath=%p (%S), lpFileName=%p (%S), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
	  lpPath,
	  lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameW(lpFileName, length+1, CanonicalPath, NULL);
        CanonicalPathPS.CloseBuffer(dw);
        if (length+1 < dw)
        {
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(lpFileName, dw, CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%S>, error is %#x. failing.\n",
                 lpPath, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
        AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
        if (NULL == AnsiPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
	    canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
			    AnsiPath, CanonicalPathLength, NULL, NULL);
	    AnsiPathPS.CloseBuffer(canonical_size);

        if(0 == access(AnsiPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCWSTR pNextPath;

        pNextPath = lpPath;

        FileNameLength = PAL_wcslen(lpFileName);

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = PAL_wcschr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + PAL_wcslen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*S is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength*sizeof(WCHAR));
            FullPath[PathLength] = '/';
            PAL_wcscpy(&FullPath[PathLength+1], lpFileName);

            FullPathPS.CloseBuffer(FullPathLength+1);

            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(FullPath, length+1,
                                  CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
                if (NULL == CanonicalPath)
                {
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    goto done;
                }
                dw = GetFullPathNameW(FullPath, dw, CanonicalPath, NULL);
                CanonicalPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%S>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
            AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
            if (NULL == AnsiPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
                                AnsiPath, CanonicalPathLength, NULL, NULL);
            AnsiPathPS.CloseBuffer(canonical_size);

            if(0 == access(AnsiPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        /* find out the required buffer size, copy path to buffer if it's
           large enough */
        nRet = PAL_wcslen(CanonicalPath)+1;
        if(nRet <= nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }
            PAL_wcscpy(lpBuffer, CanonicalPath);

            /* don't include the null-terminator in the count if buffer was
               large enough */
            nRet--;

            if(NULL != lpFilePart)
            {
                *lpFilePart = PAL_wcsrchr(lpBuffer, '/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
    }
done:
    LOGEXIT("SearchPathW returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathW);
    return nRet;
}